

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotStairsEx<ImPlot::GetterXsYs<double>>(char *label_id,GetterXsYs<double> *getter)

{
  GetterXsYs<double> getter_00;
  GetterXsYs<double> getter_01;
  GetterXsYs<double> getter_02;
  GetterXsYs<double> getter_03;
  bool bVar1;
  ImPlotScale IVar2;
  TransformerLogLog local_fc;
  double *local_f8;
  double *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  TransformerLinLog local_d4;
  double *local_d0;
  double *local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  TransformerLogLin local_ac;
  double *local_a8;
  double *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  TransformerLinLin local_84;
  double *local_80;
  double *local_78;
  undefined8 local_70;
  undefined8 local_68;
  ImU32 local_5c;
  ImU32 local_58;
  ImU32 col_fill;
  ImU32 col_line_1;
  TransformerLogLin local_4c;
  TransformerLinLin local_48;
  ImU32 local_44;
  ImDrawList *pIStack_40;
  ImU32 col_line;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  ImPlotPoint p;
  int i;
  GetterXsYs<double> *getter_local;
  char *label_id_local;
  
  bVar1 = BeginItem(label_id,0);
  if (bVar1) {
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (p.y._4_4_ = 0; p.y._4_4_ < getter->Count; p.y._4_4_ = p.y._4_4_ + 1) {
        _s = GetterXsYs<double>::operator()(getter,p.y._4_4_);
        FitPoint((ImPlotPoint *)&s);
      }
    }
    DrawList = (ImDrawList *)GetItemData();
    pIStack_40 = GetPlotDrawList();
    if ((1 < getter->Count) && (((ulong)(DrawList->_TextureIdStack).Data & 0x100000000) != 0)) {
      local_44 = ImGui::GetColorU32((ImVec4 *)DrawList);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        TransformerLinLin::TransformerLinLin(&local_48);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLin>
                  (getter,&local_48,pIStack_40,*(float *)&DrawList->_IdxWritePtr,local_44);
        break;
      case 1:
        TransformerLogLin::TransformerLogLin(&local_4c);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLin>
                  (getter,&local_4c,pIStack_40,*(float *)&DrawList->_IdxWritePtr,local_44);
        break;
      case 2:
        TransformerLinLog::TransformerLinLog((TransformerLinLog *)&col_line_1);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLog>
                  (getter,(TransformerLinLog *)&col_line_1,pIStack_40,
                   *(float *)&DrawList->_IdxWritePtr,local_44);
        break;
      case 3:
        TransformerLogLog::TransformerLogLog((TransformerLogLog *)&col_fill);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLog>
                  (getter,(TransformerLogLog *)&col_fill,pIStack_40,
                   *(float *)&DrawList->_IdxWritePtr,local_44);
      }
    }
    if (*(int *)((long)&DrawList->_IdxWritePtr + 4) != -1) {
      PopPlotClipRect();
      PushPlotClipRect((float)(DrawList->_ClipRectStack).Size);
      local_58 = ImGui::GetColorU32((ImVec4 *)&DrawList->VtxBuffer);
      local_5c = ImGui::GetColorU32((ImVec4 *)&DrawList->Flags);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        local_80 = getter->Xs;
        local_78 = getter->Ys;
        local_70._0_4_ = getter->Count;
        local_70._4_4_ = getter->Offset;
        local_68 = *(undefined8 *)&getter->Stride;
        TransformerLinLin::TransformerLinLin(&local_84);
        getter_00.Ys = local_78;
        getter_00.Xs = local_80;
        getter_00.Count = (undefined4)local_70;
        getter_00.Offset = local_70._4_4_;
        getter_00._24_8_ = local_68;
        RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<double>>
                  (getter_00,local_84,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
        break;
      case 1:
        local_a8 = getter->Xs;
        local_a0 = getter->Ys;
        local_98._0_4_ = getter->Count;
        local_98._4_4_ = getter->Offset;
        local_90 = *(undefined8 *)&getter->Stride;
        TransformerLogLin::TransformerLogLin(&local_ac);
        getter_01.Ys = local_a0;
        getter_01.Xs = local_a8;
        getter_01.Count = (undefined4)local_98;
        getter_01.Offset = local_98._4_4_;
        getter_01._24_8_ = local_90;
        RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<double>>
                  (getter_01,local_ac,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
        break;
      case 2:
        local_d0 = getter->Xs;
        local_c8 = getter->Ys;
        local_c0._0_4_ = getter->Count;
        local_c0._4_4_ = getter->Offset;
        local_b8 = *(undefined8 *)&getter->Stride;
        TransformerLinLog::TransformerLinLog(&local_d4);
        getter_02.Ys = local_c8;
        getter_02.Xs = local_d0;
        getter_02.Count = (undefined4)local_c0;
        getter_02.Offset = local_c0._4_4_;
        getter_02._24_8_ = local_b8;
        RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<double>>
                  (getter_02,local_d4,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
        break;
      case 3:
        local_f8 = getter->Xs;
        local_f0 = getter->Ys;
        local_e8._0_4_ = getter->Count;
        local_e8._4_4_ = getter->Offset;
        local_e0 = *(undefined8 *)&getter->Stride;
        TransformerLogLog::TransformerLogLog(&local_fc);
        getter_03.Ys = local_f0;
        getter_03.Xs = local_f8;
        getter_03.Count = (undefined4)local_e8;
        getter_03.Offset = local_e8._4_4_;
        getter_03._24_8_ = local_e0;
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<double>>
                  (getter_03,local_fc,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotStairsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        if (getter.Count > 1 && s.RenderLine) {
            const ImU32 col_line    = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderStairs(getter, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderStairs(getter, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderStairs(getter, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderStairs(getter, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        if (s.Marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}